

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O2

void nn_sock_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int *self_00;
  uint uVar1;
  int iVar2;
  nn_list_item *it;
  nn_list_item *pnVar3;
  undefined8 *puVar4;
  char *pcVar5;
  undefined8 uVar6;
  nn_ep *self_01;
  
  iVar2 = *(int *)&self[1].fn;
  if (type == -3 && src == -2) {
    if (iVar2 == 2) {
      uVar1 = *(uint *)(*(long *)&self[1].state + 8);
      if ((uVar1 & 1) == 0) {
        nn_efd_stop((nn_efd *)((long)&self[2].owner + 4));
        uVar1 = *(uint *)(*(long *)&self[1].state + 8);
      }
      if ((uVar1 & 2) == 0) {
        nn_efd_stop((nn_efd *)&self[2].owner);
      }
      self_00 = &self[3].state;
      it = nn_list_begin((nn_list *)self_00);
      while (pnVar3 = nn_list_end((nn_list *)self_00), it != pnVar3) {
        self_01 = (nn_ep *)&it[-8].prev;
        if (it == (nn_list_item *)0x0) {
          self_01 = (nn_ep *)0x0;
        }
        it = nn_list_next((nn_list *)self_00,it);
        nn_list_erase((nn_list *)self_00,&self_01->item);
        pnVar3 = nn_list_end((nn_list *)&self[3].owner);
        nn_list_insert((nn_list *)&self[3].owner,&self_01->item,pnVar3);
        nn_ep_stop(self_01);
      }
      *(undefined4 *)&self[1].fn = 3;
      goto LAB_00113595;
    }
    nn_backtrace_print();
    pcVar5 = "sock->state == NN_SOCK_STATE_ACTIVE";
    uVar6 = 0x353;
  }
  else if (iVar2 == 3) {
    if (type != 1 || src != 1) {
      return;
    }
    nn_list_erase((nn_list *)&self[3].owner,(nn_list_item *)((long)srcptr + 0x78));
    nn_ep_term((nn_ep *)srcptr);
    nn_free(srcptr);
LAB_00113595:
    iVar2 = nn_list_empty((nn_list *)&self[3].owner);
    if (iVar2 == 0) {
      return;
    }
    iVar2 = nn_list_empty((nn_list *)&self[3].state);
    if (iVar2 != 0) {
      *(undefined4 *)&self[1].fn = 4;
      puVar4 = *(undefined8 **)self[1].shutdown_fn;
      if ((code *)*puVar4 != (code *)0x0) {
        (*(code *)*puVar4)();
        return;
      }
LAB_00113600:
      (*(code *)puVar4[1])();
      *(undefined4 *)&self[1].fn = 5;
      nn_sem_post((nn_sem *)&self[2].ctx);
      return;
    }
    nn_backtrace_print();
    pcVar5 = "nn_list_empty (&sock->eps)";
    uVar6 = 0x381;
  }
  else {
    if (iVar2 != 4) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
              (ulong)*(uint *)&self[1].fn,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/sock.c"
              ,0x39b);
      goto LAB_001134b0;
    }
    if ((src == -2) && (type == 1)) {
      puVar4 = *(undefined8 **)self[1].shutdown_fn;
      goto LAB_00113600;
    }
    nn_backtrace_print();
    pcVar5 = "src == NN_FSM_ACTION && type == NN_SOCK_ACTION_STOPPED";
    uVar6 = 0x38c;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar5,
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/sock.c"
          ,uVar6);
LAB_001134b0:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_sock_shutdown (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_sock *sock;
    struct nn_list_item *it;
    struct nn_ep *ep;

    sock = nn_cont (self, struct nn_sock, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        nn_assert (sock->state == NN_SOCK_STATE_ACTIVE);

        /*  Close sndfd and rcvfd. This should make any current
            select/poll using SNDFD and/or RCVFD exit. */
        if (!(sock->socktype->flags & NN_SOCKTYPE_FLAG_NORECV)) {
            nn_efd_stop (&sock->rcvfd);
        }
        if (!(sock->socktype->flags & NN_SOCKTYPE_FLAG_NOSEND)) {
            nn_efd_stop (&sock->sndfd);
        }

        /*  Ask all the associated endpoints to stop. */
        it = nn_list_begin (&sock->eps);
        while (it != nn_list_end (&sock->eps)) {
            ep = nn_cont (it, struct nn_ep, item);
            it = nn_list_next (&sock->eps, it);
            nn_list_erase (&sock->eps, &ep->item);
            nn_list_insert (&sock->sdeps, &ep->item,
                nn_list_end (&sock->sdeps));
            nn_ep_stop (ep);

        }
        sock->state = NN_SOCK_STATE_STOPPING_EPS;
        goto finish2;
    }
    if (nn_slow (sock->state == NN_SOCK_STATE_STOPPING_EPS)) {

        if (!(src == NN_SOCK_SRC_EP && type == NN_EP_STOPPED)) {
            /*  If we got here waiting for EPs to teardown, but src is
                not an EP, then it isn't safe for us to do anything,
                because we just need to wait for the EPs to finish
                up their thing.  Just bail. */
            return;
        }
        /*  Endpoint is stopped. Now we can safely deallocate it. */
        ep = (struct nn_ep*) srcptr;
        nn_list_erase (&sock->sdeps, &ep->item);
        nn_ep_term (ep);
        nn_free (ep);

finish2:
        /*  If all the endpoints are deallocated, we can start stopping
            protocol-specific part of the socket. If there' no stop function
            we can consider it stopped straight away. */
        if (!nn_list_empty (&sock->sdeps))
            return;
        nn_assert (nn_list_empty (&sock->eps));
        sock->state = NN_SOCK_STATE_STOPPING;
        if (!sock->sockbase->vfptr->stop)
            goto finish1;
        sock->sockbase->vfptr->stop (sock->sockbase);
        return;
    }
    if (nn_slow (sock->state == NN_SOCK_STATE_STOPPING)) {

        /*  We get here when the deallocation of the socket was delayed by the
            specific socket type. */
        nn_assert (src == NN_FSM_ACTION && type == NN_SOCK_ACTION_STOPPED);

finish1:
        /*  Protocol-specific part of the socket is stopped.
            We can safely deallocate it. */
        sock->sockbase->vfptr->destroy (sock->sockbase);
        sock->state = NN_SOCK_STATE_FINI;

        /*  Now we can unblock the application thread blocked in
            the nn_close() call. */
        nn_sem_post (&sock->termsem);

        return;
    }

    nn_fsm_bad_state(sock->state, src, type);
}